

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

void __thiscall gvr::Mesh::resizeTriangleList(Mesh *this,int tn)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < tn) {
    uVar4 = (long)(tn * 3) << 2;
  }
  puVar2 = (uint *)operator_new__(uVar4);
  iVar3 = this->n;
  if (tn <= this->n) {
    iVar3 = tn;
  }
  if (iVar3 < 1) {
    puVar5 = this->triangle;
    if (puVar5 == (uint *)0x0) goto LAB_0011b09b;
  }
  else {
    puVar5 = this->triangle;
    iVar1 = iVar3 * 3 + 1;
    uVar4 = (ulong)(iVar3 * 3 - 1);
    do {
      puVar2[uVar4] = puVar5[uVar4];
      iVar1 = iVar1 + -1;
      uVar4 = uVar4 - 1;
    } while (1 < iVar1);
  }
  operator_delete__(puVar5);
LAB_0011b09b:
  this->triangle = puVar2;
  this->n = tn;
  return;
}

Assistant:

void Mesh::resizeTriangleList(int tn)
{
  unsigned int *p=new unsigned int [3*tn];

  for (int i=3*std::min(n, tn)-1; i>=0; i--)
  {
    p[i]=triangle[i];
  }

  delete [] triangle;

  triangle=p;
  n=tn;
}